

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbt2DShape.cpp
# Opt level: O2

void __thiscall
cbt2DsegmentShape::calculateLocalInertia(cbt2DsegmentShape *this,cbtScalar mass,cbtVector3 *inertia)

{
  float fVar1;
  cbtScalar cVar2;
  undefined1 in_register_00001204 [60];
  undefined1 auVar4 [56];
  undefined1 auVar3 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  cbtVector3 cVar7;
  cbtVector3 local_18;
  
  auVar6 = in_ZMM1._8_56_;
  auVar4 = in_register_00001204._4_56_;
  cVar7 = ::operator-(&this->P2,(cbtVector3 *)&(this->super_cbtConvexInternalShape).field_0x44);
  auVar5._0_8_ = cVar7.m_floats._8_8_;
  auVar5._8_56_ = auVar6;
  auVar3._0_8_ = cVar7.m_floats._0_8_;
  auVar3._8_56_ = auVar4;
  local_18.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar3._0_16_,auVar5._0_16_);
  cVar2 = cbtVector3::length(&local_18);
  fVar1 = cVar2 * 0.5 + 0.04;
  fVar1 = fVar1 + fVar1;
  fVar1 = fVar1 * fVar1;
  fVar1 = mass * 0.08333333 * (fVar1 + fVar1);
  inertia->m_floats[0] = fVar1;
  inertia->m_floats[1] = fVar1;
  inertia->m_floats[2] = fVar1;
  return;
}

Assistant:

void	cbt2DsegmentShape::calculateLocalInertia(cbtScalar mass,cbtVector3& inertia) const
{
	//***TO DO***
	//as an approximation, take the inertia of the box that bounds the barrell

	cbtTransform ident;
	ident.setIdentity();

    double hlen = 0.5*(P2-P1).length();

	cbtVector3 halfExtents;

	halfExtents.setValue((cbtScalar)(hlen), 
						 (cbtScalar)(hlen),
						 (cbtScalar)(hlen));

	cbtScalar margin = CONVEX_DISTANCE_MARGIN;

	cbtScalar lx=cbtScalar(2.)*(halfExtents[0]+margin);
	cbtScalar ly=cbtScalar(2.)*(halfExtents[1]+margin);
	cbtScalar lz=cbtScalar(2.)*(halfExtents[2]+margin);
	const cbtScalar x2 = lx*lx;
	const cbtScalar y2 = ly*ly;
	const cbtScalar z2 = lz*lz;
	const cbtScalar scaledmass = mass * cbtScalar(.08333333);

	inertia[0] = scaledmass * (y2+z2);
	inertia[1] = scaledmass * (x2+z2);
	inertia[2] = scaledmass * (x2+y2);
}